

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPrivateKey.cpp
# Opt level: O2

bool __thiscall EDPrivateKey::deserialise(EDPrivateKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dK;
  ByteString dEC;
  ByteString BStack_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&BStack_68,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&BStack_68);
    if (sVar1 != 0) {
      (**(code **)(*(long *)this + 0x50))(this,&local_40);
      bVar2 = true;
      (**(code **)(*(long *)this + 0x48))(this,&BStack_68);
      goto LAB_0014d07e;
    }
  }
  bVar2 = false;
LAB_0014d07e:
  ByteString::~ByteString(&BStack_68);
  ByteString::~ByteString(&local_40);
  return bVar2;
}

Assistant:

bool EDPrivateKey::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);
	ByteString dK = ByteString::chainDeserialise(serialised);

	if ((dEC.size() == 0) ||
	    (dK.size() == 0))
	{
		return false;
	}

	setEC(dEC);
	setK(dK);

	return true;
}